

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxvolume.cc
# Opt level: O2

void __thiscall ipx::Maxvolume::Slice::Slice(Slice *this,Int m,Int n)

{
  int dim;
  size_t __n;
  allocator_type local_41;
  vector<bool,_std::allocator<bool>_> *local_40;
  Vector *local_38;
  
  dim = n + m;
  std::valarray<double>::valarray(&this->colscale,(long)dim);
  __n = (size_t)m;
  std::valarray<double>::valarray(&this->invscale_basic,__n);
  local_40 = &this->tblrow_used;
  local_38 = &this->invscale_basic;
  std::vector<bool,_std::allocator<bool>_>::vector(local_40,__n,&local_41);
  std::valarray<double>::valarray(&this->colweights,(long)dim);
  IndexedVector::IndexedVector(&this->lhs,m);
  IndexedVector::IndexedVector(&this->row,dim);
  std::valarray<double>::valarray(&this->work,__n);
  return;
}

Assistant:

Slice(Int m, Int n) :
        colscale(n+m), invscale_basic(m), tblrow_used(m), colweights(n+m),
        lhs(m), row(n+m), work(m) {}